

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

size_t __thiscall
std::hash<groundupdb::HashedValue>::operator()(hash<groundupdb::HashedValue> *this,HashedValue *v)

{
  byte *vpart;
  ulong uVar1;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_20;
  
  groundupdb::HashedValue::data((Bytes *)&local_20,v);
  uVar1 = 0;
  for (; local_20._M_impl.super__Vector_impl_data._M_start !=
         local_20._M_impl.super__Vector_impl_data._M_finish;
      local_20._M_impl.super__Vector_impl_data._M_start =
           local_20._M_impl.super__Vector_impl_data._M_start + 1) {
    uVar1 = uVar1 ^ (uint)*local_20._M_impl.super__Vector_impl_data._M_start * 2;
  }
  _Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_20);
  return uVar1;
}

Assistant:

size_t operator()(const groundupdb::HashedValue& v) const
        {
          std::size_t hv = 0;
          for (auto& vpart : v.data()) {
            hv = hv ^ (std::to_integer<std::size_t>(vpart) << 1);
          }
          return hv;
        }